

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void parse_line_action(parse_state *state,int nargs,char **args)

{
  byte bVar1;
  void *pvVar2;
  char *s;
  uint uVar3;
  listnode *item;
  char *pcVar4;
  
  if (nargs == 0) {
    return;
  }
  pvVar2 = state->context;
  s = *args;
  uVar3 = lookup_keyword(s);
  if ((keyword_info[uVar3].flags & 2) == 0) {
    parse_error(state,"invalid command \'%s\'\n",s);
    return;
  }
  bVar1 = keyword_info[uVar3].nargs;
  if (nargs < (int)(uint)bVar1) {
    pcVar4 = "argument";
    if (2 < bVar1) {
      pcVar4 = "arguments";
    }
    parse_error(state,"%s requires %d %s\n",s,(ulong)(bVar1 - 1),pcVar4);
    return;
  }
  item = (listnode *)malloc((ulong)(uint)nargs * 8 + 0x28);
  item[1].next = (listnode *)keyword_info[uVar3].func;
  *(int *)&item[1].prev = nargs;
  memcpy(item + 2,args,(ulong)(uint)nargs << 3);
  list_add_tail((listnode *)((long)pvVar2 + 0x40),item);
  return;
}

Assistant:

static void parse_line_action(struct parse_state* state, int nargs, char **args)
{
    struct command *cmd;
    struct action *act = state->context;
    int (*func)(int nargs, char **args);
    int kw, n;

    if (nargs == 0) {
        return;
    }

    kw = lookup_keyword(args[0]);
    if (!kw_is(kw, COMMAND)) {
        parse_error(state, "invalid command '%s'\n", args[0]);
        return;
    }

    n = kw_nargs(kw);
    if (nargs < n) {
        parse_error(state, "%s requires %d %s\n", args[0], n - 1,
            n > 2 ? "arguments" : "argument");
        return;
    }
    cmd = malloc(sizeof(*cmd) + sizeof(char*) * nargs);
    cmd->func = kw_func(kw);
    cmd->nargs = nargs;
    memcpy(cmd->args, args, sizeof(char*) * nargs);
    list_add_tail(&act->commands, &cmd->clist);
}